

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

void __thiscall
flatbuffers::BinaryAnnotator::BuildTable
          (BinaryAnnotator *this,uint64_t table_offset,BinarySectionType type,Object *table)

{
  uint64_t uVar1;
  BinaryRegionType BVar2;
  bool bVar3;
  uint16_t uVar4;
  BaseType BVar5;
  uint uVar6;
  String *pSVar7;
  int *piVar8;
  VTable *pVVar9;
  reference ppVar10;
  iterator iVar11;
  iterator iVar12;
  Field *pFVar13;
  reference pvVar14;
  uint64_t uVar15;
  unsigned_long length_00;
  uint *puVar16;
  Type *pTVar17;
  size_t sVar18;
  uchar *puVar19;
  char *pcVar20;
  Field *__s;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_00;
  pointer ppVar21;
  reference pvVar22;
  pointer pEVar23;
  int __c;
  Optional<unsigned_long> OVar24;
  pointer local_1c18;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_1b38;
  string local_1b20;
  BinarySection local_1b00;
  BinaryRegionComment local_1ac0;
  BinaryRegion local_1a48;
  undefined1 local_19a8 [8];
  BinaryRegionComment padding_comment;
  uint64_t pad_bytes;
  uint64_t i;
  BinaryRegion local_18a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17e8;
  undefined1 local_17c8 [8];
  string enum_type;
  BinaryRegion local_1730;
  allocator<char> local_1689;
  string local_1688;
  uint64_t local_1668;
  uint64_t remaining_4;
  uint64_t uStack_1658;
  Optional<unsigned_char> realized_type;
  uint64_t type_offset;
  _Self local_1648;
  const_iterator vtable_field_1;
  uint16_t union_type_id;
  uint64_t union_offset;
  BinaryRegionComment local_1600;
  BinaryRegion local_1588;
  map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  local_14e8;
  BinaryRegionComment local_14b8;
  BinaryRegion local_1440;
  BinaryRegionComment local_13a0;
  BinaryRegion local_1328;
  BinaryRegionComment local_1288;
  BinaryRegion local_1210;
  allocator<char> local_1169;
  string local_1168;
  return_type local_1148;
  Object *next_object;
  BinaryRegion local_10c8;
  allocator<char> local_1021;
  string local_1020;
  BinaryRegionComment local_1000;
  BinaryRegion local_f88;
  allocator<char> local_ee1;
  string local_ee0;
  uint64_t local_ec0;
  uint64_t remaining_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e90;
  undefined1 local_e70 [8];
  string offset_prefix;
  BinaryRegionComment offset_field_comment;
  uint64_t offset_of_next_item;
  int local_dc4;
  _Storage<unsigned_long,_true> local_dc0;
  undefined1 local_db8;
  BinaryRegionType local_dac;
  uint64_t uStack_da8;
  BinaryRegionType region_type;
  uint64_t length;
  uint64_t offset;
  BinaryRegion local_d20;
  BinaryRegionComment local_c80;
  BinaryRegion local_c08;
  allocator<char> local_b61;
  string local_b60;
  _Optional_payload_base<unsigned_char> local_b3a;
  undefined1 local_b38 [6];
  Optional<unsigned_char> enum_value;
  BinaryRegion local_ac0;
  string local_a20;
  uint64_t local_a00;
  uint64_t remaining_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  undefined1 local_970 [8];
  BinaryRegionComment scalar_field_comment;
  BinaryRegionType region_type_1;
  uint64_t type_size;
  BinaryRegion local_870;
  BinaryRegionComment local_7d0;
  BinaryRegion local_758;
  string local_6b8;
  uint64_t local_698;
  uint64_t remaining_1;
  BinaryRegionComment unknown_field_comment;
  _Optional_payload_base<unsigned_int> local_5f8;
  Optional<unsigned_int> relative_offset;
  string hint;
  uint64_t unknown_field_length;
  uint64_t field_offset;
  uint16_t offset_from_table;
  Field *field;
  size_t i_1;
  pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry> *vtable_field;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  *__range1;
  vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
  fields;
  uint64_t table_end_offset;
  uint16_t table_size;
  VTable *vtable;
  BinaryRegion local_4c8;
  undefined1 local_428 [8];
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  BinaryRegion local_398;
  string local_2f8;
  BinarySection local_2d8;
  allocator<char> local_291;
  string local_290;
  uint64_t local_270;
  uint64_t vtable_offset;
  BinaryRegionComment local_260;
  BinaryRegion local_1e8;
  string local_148;
  BinarySection local_128;
  allocator<char> local_e1;
  string local_e0;
  uint64_t local_c0;
  uint64_t remaining;
  _Optional_payload_base<int> local_a8;
  Optional<int> vtable_soffset;
  BinaryRegionComment vtable_offset_comment;
  Object *table_local;
  BinarySectionType type_local;
  uint64_t table_offset_local;
  BinaryAnnotator *this_local;
  
  bVar3 = ContainsSection(this,table_offset);
  if (!bVar3) {
    BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)&vtable_soffset);
    local_a8 = (_Optional_payload_base<int>)ReadScalar<int>(this,table_offset);
    bVar3 = std::optional<int>::has_value((optional<int> *)&local_a8);
    if (bVar3) {
      piVar8 = std::optional<int>::value((optional<int> *)&local_a8);
      local_270 = table_offset - (long)*piVar8;
      bVar3 = IsValidOffset(this,local_270);
      if (bVar3) {
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
                  ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                   local_428);
        uVar15 = local_270;
        BinaryRegionComment::BinaryRegionComment
                  ((BinaryRegionComment *)&vtable,(BinaryRegionComment *)&vtable_soffset);
        anon_unknown_46::MakeBinaryRegion
                  (&local_4c8,table_offset,4,SOffset,0,uVar15,(BinaryRegionComment *)&vtable);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                  local_428,&local_4c8);
        BinaryRegion::~BinaryRegion(&local_4c8);
        BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&vtable);
        pVVar9 = GetOrBuildVTable(this,local_270,table,table_offset);
        if (pVVar9 == (VTable *)0x0) {
          vtable_offset._4_4_ = 1;
        }
        else {
          fields.
          super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(table_offset + pVVar9->table_size);
          bVar3 = IsValidOffset(this,(uint64_t)
                                     &fields.
                                      super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].
                                      field_0xf);
          if (!bVar3) {
            fields.
            super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this->binary_length_;
          }
          std::
          vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
          ::vector((vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                    *)&__range1);
          __end1 = std::
                   map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                   ::begin(&pVVar9->fields);
          vtable_field = (pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry> *)
                         std::
                         map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                         ::end(&pVVar9->fields);
          while (bVar3 = std::operator!=(&__end1,(_Self *)&vtable_field), bVar3) {
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>
                      ::operator*(&__end1);
            std::
            vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
            ::push_back((vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                         *)&__range1,&ppVar10->second);
            std::
            _Rb_tree_const_iterator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>
            ::operator++(&__end1);
          }
          iVar11 = std::
                   vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                   ::begin((vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                            *)&__range1);
          iVar12 = std::
                   vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                   ::end((vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                          *)&__range1);
          std::
          stable_sort<__gnu_cxx::__normal_iterator<flatbuffers::BinaryAnnotator::VTable::Entry*,std::vector<flatbuffers::BinaryAnnotator::VTable::Entry,std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>>>,flatbuffers::BinaryAnnotator::BuildTable(unsigned_long,flatbuffers::BinarySectionType,reflection::Object_const*)::__0>
                    (iVar11._M_current,iVar12._M_current);
          for (field = (Field *)0x0;
              pFVar13 = (Field *)std::
                                 vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                 ::size((vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                         *)&__range1), field < pFVar13; field = field + 1) {
            pvVar14 = std::
                      vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                      ::operator[]((vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                    *)&__range1,(size_type_conflict)field);
            pFVar13 = pvVar14->field;
            pvVar14 = std::
                      vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                      ::operator[]((vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                    *)&__range1,(size_type_conflict)field);
            if (pvVar14->offset_from_table != 0) {
              uVar15 = table_offset + pvVar14->offset_from_table;
              bVar3 = IsValidOffset(this,uVar15);
              if (!bVar3) goto LAB_0039e967;
              if (pFVar13 == (Field *)0x0) {
                pFVar13 = (Field *)std::
                                   vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                   ::size((vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                           *)&__range1);
                if (field + 1 < pFVar13) {
                  pvVar14 = std::
                            vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                            ::operator[]((vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                                          *)&__range1,(size_type_conflict)(field + 1));
                  local_1c18 = (pointer)(table_offset + pvVar14->offset_from_table);
                }
                else {
                  local_1c18 = fields.
                               super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                length_00 = (long)local_1c18 - uVar15;
                if (length_00 != 0) {
                  std::__cxx11::string::string((string *)&relative_offset);
                  if (length_00 == 4) {
                    local_5f8 = (_Optional_payload_base<unsigned_int>)
                                ReadScalar<unsigned_int>(this,uVar15);
                    bVar3 = std::optional<unsigned_int>::has_value
                                      ((optional<unsigned_int> *)&local_5f8);
                    if (bVar3) {
                      std::__cxx11::string::operator+=
                                ((string *)&relative_offset,"<possibly an offset? Check Loc: +0x");
                      puVar16 = std::optional<unsigned_int>::value
                                          ((optional<unsigned_int> *)&local_5f8);
                      ToHex<unsigned_long>
                                ((string *)&unknown_field_comment.index,uVar15 + *puVar16,8);
                      std::__cxx11::string::operator+=
                                ((string *)&relative_offset,(string *)&unknown_field_comment.index);
                      std::__cxx11::string::~string((string *)&unknown_field_comment.index);
                      std::__cxx11::string::operator+=((string *)&relative_offset,">");
                    }
                  }
                  BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)&remaining_1);
                  unknown_field_comment.status_message.field_2._8_4_ = 0xb;
                  bVar3 = IsValidRead(this,uVar15,length_00);
                  if (bVar3) {
                    std::__cxx11::string::operator=
                              ((string *)(unknown_field_comment.name.field_2._M_local_buf + 8),
                               (string *)&relative_offset);
                    BinaryRegionComment::BinaryRegionComment
                              ((BinaryRegionComment *)&type_size,(BinaryRegionComment *)&remaining_1
                              );
                    anon_unknown_46::MakeBinaryRegion
                              (&local_870,uVar15,length_00,Unknown,length_00,0,
                               (BinaryRegionComment *)&type_size);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_428,&local_870);
                    BinaryRegion::~BinaryRegion(&local_870);
                    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&type_size);
                  }
                  else {
                    local_698 = RemainingBytes(this,uVar15);
                    std::__cxx11::to_string(&local_6b8,length_00);
                    anon_unknown_46::SetError
                              ((BinaryRegionComment *)&remaining_1,ERROR_INCOMPLETE_BINARY,
                               &local_6b8);
                    std::__cxx11::string::~string((string *)&local_6b8);
                    uVar1 = local_698;
                    BinaryRegionComment::BinaryRegionComment
                              (&local_7d0,(BinaryRegionComment *)&remaining_1);
                    anon_unknown_46::MakeBinaryRegion
                              (&local_758,uVar15,uVar1,Unknown,uVar1,0,&local_7d0);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_428,&local_758);
                    BinaryRegion::~BinaryRegion(&local_758);
                    BinaryRegionComment::~BinaryRegionComment(&local_7d0);
                  }
                  vtable_offset._4_4_ = 6;
                  BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&remaining_1);
                  std::__cxx11::string::~string((string *)&relative_offset);
                }
                goto LAB_0039e967;
              }
              pTVar17 = reflection::Field::type(pFVar13);
              BVar5 = reflection::Type::base_type(pTVar17);
              bVar3 = IsScalar(BVar5);
              if (bVar3) {
                pTVar17 = reflection::Field::type(pFVar13);
                BVar5 = reflection::Type::base_type(pTVar17);
                sVar18 = GetTypeSize(BVar5);
                pTVar17 = reflection::Field::type(pFVar13);
                BVar5 = reflection::Type::base_type(pTVar17);
                scalar_field_comment.index._4_4_ = GetRegionType(BVar5);
                BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_970);
                scalar_field_comment.status_message.field_2._8_4_ = 10;
                pSVar7 = reflection::Field::name(pFVar13);
                pcVar20 = String::c_str(pSVar7);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_9f0,pcVar20,(allocator<char> *)((long)&remaining_2 + 7))
                ;
                std::operator+(&local_9d0,&local_9f0,"` (");
                pTVar17 = reflection::Field::type(pFVar13);
                BVar5 = reflection::Type::base_type(pTVar17);
                pcVar20 = reflection::EnumNameBaseType(BVar5);
                std::operator+(&local_9b0,&local_9d0,pcVar20);
                std::operator+(&local_990,&local_9b0,")");
                std::__cxx11::string::operator=
                          ((string *)&scalar_field_comment.type,(string *)&local_990);
                std::__cxx11::string::~string((string *)&local_990);
                std::__cxx11::string::~string((string *)&local_9b0);
                std::__cxx11::string::~string((string *)&local_9d0);
                std::__cxx11::string::~string((string *)&local_9f0);
                std::allocator<char>::~allocator((allocator<char> *)((long)&remaining_2 + 7));
                bVar3 = IsValidRead(this,uVar15,sVar18);
                if (bVar3) {
                  bVar3 = IsUnionType(this,pFVar13);
                  if (bVar3) {
                    local_b3a = (_Optional_payload_base<unsigned_char>)
                                ReadScalar<unsigned_char>(this,uVar15);
                    puVar19 = std::optional<unsigned_char>::value
                                        ((optional<unsigned_char> *)&local_b3a);
                    bVar3 = IsValidUnionValue(this,pFVar13,*puVar19);
                    if (!bVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_b60,"",&local_b61);
                      anon_unknown_46::SetError
                                ((BinaryRegionComment *)local_970,ERROR_INVALID_UNION_TYPE,
                                 &local_b60);
                      std::__cxx11::string::~string((string *)&local_b60);
                      std::allocator<char>::~allocator(&local_b61);
                      BVar2 = scalar_field_comment.index._4_4_;
                      BinaryRegionComment::BinaryRegionComment
                                (&local_c80,(BinaryRegionComment *)local_970);
                      anon_unknown_46::MakeBinaryRegion
                                (&local_c08,uVar15,sVar18,BVar2,0,0,&local_c80);
                      std::
                      vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ::push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                   *)local_428,&local_c08);
                      BinaryRegion::~BinaryRegion(&local_c08);
                      BinaryRegionComment::~BinaryRegionComment(&local_c80);
                      goto LAB_0039d579;
                    }
                  }
                  BVar2 = scalar_field_comment.index._4_4_;
                  BinaryRegionComment::BinaryRegionComment
                            ((BinaryRegionComment *)&offset,(BinaryRegionComment *)local_970);
                  anon_unknown_46::MakeBinaryRegion
                            (&local_d20,uVar15,sVar18,BVar2,0,0,(BinaryRegionComment *)&offset);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_428,&local_d20);
                  BinaryRegion::~BinaryRegion(&local_d20);
                  BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&offset);
                }
                else {
                  local_a00 = RemainingBytes(this,uVar15);
                  std::__cxx11::to_string(&local_a20,sVar18);
                  anon_unknown_46::SetError
                            ((BinaryRegionComment *)local_970,ERROR_INCOMPLETE_BINARY,&local_a20);
                  std::__cxx11::string::~string((string *)&local_a20);
                  uVar1 = local_a00;
                  BinaryRegionComment::BinaryRegionComment
                            ((BinaryRegionComment *)local_b38,(BinaryRegionComment *)local_970);
                  anon_unknown_46::MakeBinaryRegion
                            (&local_ac0,uVar15,uVar1,Unknown,uVar1,0,
                             (BinaryRegionComment *)local_b38);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_428,&local_ac0);
                  BinaryRegion::~BinaryRegion(&local_ac0);
                  BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_b38);
                }
LAB_0039d579:
                vtable_offset._4_4_ = 6;
                BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_970);
                goto LAB_0039e967;
              }
              length = 0;
              uStack_da8 = 4;
              local_dac = UOffset;
              bVar3 = reflection::Field::offset64(pFVar13);
              if (bVar3) {
                uStack_da8 = 8;
                local_dac = UOffset64;
                OVar24 = ReadScalar<unsigned_long>(this,uVar15);
                local_dc0._M_value =
                     OVar24.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_payload;
                local_db8 = OVar24.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long>._M_engaged;
                local_dc4 = 0;
                length = std::optional<unsigned_long>::value_or<int>
                                   ((optional<unsigned_long> *)&local_dc0,&local_dc4);
              }
              else {
                register0x00000000 =
                     (_Optional_payload_base<unsigned_int>)ReadScalar<unsigned_int>(this,uVar15);
                offset_of_next_item._0_4_ = 0;
                uVar6 = std::optional<unsigned_int>::value_or<int>
                                  ((optional<unsigned_int> *)((long)&offset_of_next_item + 4),
                                   (int *)&offset_of_next_item);
                length = (uint64_t)uVar6;
              }
              offset_field_comment.index = 0;
              BinaryRegionComment::BinaryRegionComment
                        ((BinaryRegionComment *)((long)&offset_prefix.field_2 + 8));
              offset_field_comment.status_message.field_2._8_4_ = 0xc;
              pSVar7 = reflection::Field::name(pFVar13);
              pcVar20 = String::c_str(pSVar7);
              std::__cxx11::string::operator=((string *)&offset_field_comment.type,pcVar20);
              pSVar7 = reflection::Field::name(pFVar13);
              pcVar20 = String::c_str(pSVar7);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_eb0,pcVar20,(allocator<char> *)((long)&remaining_3 + 7));
              std::operator+(&local_e90,"offset to field `",&local_eb0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e70,&local_e90,"`");
              std::__cxx11::string::~string((string *)&local_e90);
              std::__cxx11::string::~string((string *)&local_eb0);
              std::allocator<char>::~allocator((allocator<char> *)((long)&remaining_3 + 7));
              __s = pFVar13;
              bVar3 = IsInlineField(this,pFVar13);
              if (!bVar3) {
                if (length == 0) {
                  local_ec0 = RemainingBytes(this,uVar15);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_ee0,"4",&local_ee1);
                  anon_unknown_46::SetError
                            ((BinaryRegionComment *)((long)&offset_prefix.field_2 + 8),
                             ERROR_INCOMPLETE_BINARY,&local_ee0);
                  std::__cxx11::string::~string((string *)&local_ee0);
                  std::allocator<char>::~allocator(&local_ee1);
                  uVar1 = local_ec0;
                  BinaryRegionComment::BinaryRegionComment
                            (&local_1000,(BinaryRegionComment *)((long)&offset_prefix.field_2 + 8));
                  anon_unknown_46::MakeBinaryRegion
                            (&local_f88,uVar15,uVar1,Unknown,uVar1,0,&local_1000);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_428,&local_f88);
                  BinaryRegion::~BinaryRegion(&local_f88);
                  BinaryRegionComment::~BinaryRegionComment(&local_1000);
                  vtable_offset._4_4_ = 6;
                }
                else {
                  __s = (Field *)(uVar15 + length);
                  offset_field_comment.index = (size_t)__s;
                  bVar3 = IsValidOffset(this,(uint64_t)__s);
                  if (bVar3) goto LAB_0039dc4a;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1020,"",&local_1021);
                  anon_unknown_46::SetError
                            ((BinaryRegionComment *)((long)&offset_prefix.field_2 + 8),
                             ERROR_OFFSET_OUT_OF_BINARY,&local_1020);
                  std::__cxx11::string::~string((string *)&local_1020);
                  std::allocator<char>::~allocator(&local_1021);
                  uVar1 = uStack_da8;
                  BVar2 = local_dac;
                  sVar18 = offset_field_comment.index;
                  BinaryRegionComment::BinaryRegionComment
                            ((BinaryRegionComment *)&next_object,
                             (BinaryRegionComment *)((long)&offset_prefix.field_2 + 8));
                  anon_unknown_46::MakeBinaryRegion
                            (&local_10c8,uVar15,uVar1,BVar2,0,sVar18,
                             (BinaryRegionComment *)&next_object);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_428,&local_10c8);
                  BinaryRegion::~BinaryRegion(&local_10c8);
                  BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&next_object);
                  vtable_offset._4_4_ = 6;
                }
                goto LAB_0039e93f;
              }
LAB_0039dc4a:
              pTVar17 = reflection::Field::type(pFVar13);
              BVar5 = reflection::Type::base_type(pTVar17);
              sVar18 = offset_field_comment.index;
              switch(BVar5) {
              case String:
                std::__cxx11::string::operator=
                          ((string *)(offset_field_comment.name.field_2._M_local_buf + 8),"(string)"
                          );
                uVar1 = uStack_da8;
                BVar2 = local_dac;
                sVar18 = offset_field_comment.index;
                BinaryRegionComment::BinaryRegionComment
                          (&local_13a0,(BinaryRegionComment *)((long)&offset_prefix.field_2 + 8));
                anon_unknown_46::MakeBinaryRegion
                          (&local_1328,uVar15,uVar1,BVar2,0,sVar18,&local_13a0);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           *)local_428,&local_1328);
                BinaryRegion::~BinaryRegion(&local_1328);
                BinaryRegionComment::~BinaryRegionComment(&local_13a0);
                BuildString(this,offset_field_comment.index,table,pFVar13);
                break;
              case Vector:
                std::__cxx11::string::operator=
                          ((string *)(offset_field_comment.name.field_2._M_local_buf + 8),"(vector)"
                          );
                uVar1 = uStack_da8;
                BVar2 = local_dac;
                sVar18 = offset_field_comment.index;
                BinaryRegionComment::BinaryRegionComment
                          (&local_14b8,(BinaryRegionComment *)((long)&offset_prefix.field_2 + 8));
                anon_unknown_46::MakeBinaryRegion
                          (&local_1440,uVar15,uVar1,BVar2,0,sVar18,&local_14b8);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           *)local_428,&local_1440);
                BinaryRegion::~BinaryRegion(&local_1440);
                BinaryRegionComment::~BinaryRegionComment(&local_14b8);
                sVar18 = offset_field_comment.index;
                std::
                map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                ::map(&local_14e8,&pVVar9->fields);
                BuildVector(this,sVar18,table,pFVar13,table_offset,&local_14e8);
                std::
                map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                ::~map(&local_14e8);
                break;
              case Obj:
                this_00 = reflection::Schema::objects(this->schema_);
                pTVar17 = reflection::Field::type(pFVar13);
                pcVar20 = reflection::Type::index(pTVar17,(char *)__s,__c);
                local_1148 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                                       (this_00,(uint)pcVar20);
                bVar3 = reflection::Object::is_struct(local_1148);
                if (bVar3) {
                  pSVar7 = reflection::Field::name(pFVar13);
                  pcVar20 = String::c_str(pSVar7);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1168,pcVar20,&local_1169);
                  BuildStruct(this,uVar15,
                              (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_428,&local_1168,local_1148);
                  std::__cxx11::string::~string((string *)&local_1168);
                  std::allocator<char>::~allocator(&local_1169);
                }
                else {
                  std::__cxx11::string::operator=
                            ((string *)(offset_field_comment.name.field_2._M_local_buf + 8),
                             "(table)");
                  uVar1 = uStack_da8;
                  BVar2 = local_dac;
                  sVar18 = offset_field_comment.index;
                  BinaryRegionComment::BinaryRegionComment
                            (&local_1288,(BinaryRegionComment *)((long)&offset_prefix.field_2 + 8));
                  anon_unknown_46::MakeBinaryRegion
                            (&local_1210,uVar15,uVar1,BVar2,0,sVar18,&local_1288);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_428,&local_1210);
                  BinaryRegion::~BinaryRegion(&local_1210);
                  BinaryRegionComment::~BinaryRegionComment(&local_1288);
                  BuildTable(this,offset_field_comment.index,Table,local_1148);
                }
                break;
              case Union:
                uVar4 = reflection::Field::id(pFVar13);
                vtable_field_1._M_node._6_2_ = uVar4 - 1;
                local_1648._M_node =
                     (_Base_ptr)
                     std::
                     map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                     ::find(&pVVar9->fields,(key_type_conflict *)((long)&vtable_field_1._M_node + 6)
                           );
                type_offset = (uint64_t)
                              std::
                              map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                              ::end(&pVVar9->fields);
                bVar3 = std::operator==(&local_1648,(_Self *)&type_offset);
                if (bVar3) break;
                std::__cxx11::string::operator=
                          ((string *)(offset_field_comment.name.field_2._M_local_buf + 8),"(union)")
                ;
                ppVar21 = std::
                          _Rb_tree_const_iterator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>
                          ::operator->(&local_1648);
                uStack_1658 = table_offset + (ppVar21->second).offset_from_table;
                remaining_4._6_2_ =
                     (_Optional_payload_base<unsigned_char>)
                     ReadScalar<unsigned_char>(this,uStack_1658);
                bVar3 = std::optional<unsigned_char>::has_value
                                  ((optional<unsigned_char> *)((long)&remaining_4 + 6));
                if (bVar3) {
                  puVar19 = std::optional<unsigned_char>::value
                                      ((optional<unsigned_char> *)((long)&remaining_4 + 6));
                  bVar3 = IsValidUnionValue(this,pFVar13,*puVar19);
                  if (bVar3) {
                    puVar19 = std::optional<unsigned_char>::value
                                        ((optional<unsigned_char> *)((long)&remaining_4 + 6));
                    BuildUnion_abi_cxx11_((string *)local_17c8,this,sVar18,*puVar19,pFVar13);
                    std::operator+(&local_1808,"(union of type `",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_17c8);
                    std::operator+(&local_17e8,&local_1808,"`)");
                    std::__cxx11::string::operator=
                              ((string *)(offset_field_comment.name.field_2._M_local_buf + 8),
                               (string *)&local_17e8);
                    std::__cxx11::string::~string((string *)&local_17e8);
                    std::__cxx11::string::~string((string *)&local_1808);
                    uVar1 = uStack_da8;
                    BVar2 = local_dac;
                    BinaryRegionComment::BinaryRegionComment
                              ((BinaryRegionComment *)&i,
                               (BinaryRegionComment *)((long)&offset_prefix.field_2 + 8));
                    anon_unknown_46::MakeBinaryRegion
                              (&local_18a8,uVar15,uVar1,BVar2,0,sVar18,(BinaryRegionComment *)&i);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_428,&local_18a8);
                    BinaryRegion::~BinaryRegion(&local_18a8);
                    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&i);
                    std::__cxx11::string::~string((string *)local_17c8);
                    break;
                  }
                  vtable_offset._4_4_ = 6;
                }
                else {
                  local_1668 = RemainingBytes(this,uStack_1658);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1688,"1",&local_1689);
                  anon_unknown_46::SetError
                            ((BinaryRegionComment *)((long)&offset_prefix.field_2 + 8),
                             ERROR_INCOMPLETE_BINARY,&local_1688);
                  std::__cxx11::string::~string((string *)&local_1688);
                  std::allocator<char>::~allocator(&local_1689);
                  uVar1 = uStack_1658;
                  uVar15 = local_1668;
                  BinaryRegionComment::BinaryRegionComment
                            ((BinaryRegionComment *)((long)&enum_type.field_2 + 8),
                             (BinaryRegionComment *)((long)&offset_prefix.field_2 + 8));
                  anon_unknown_46::MakeBinaryRegion
                            (&local_1730,uVar1,uVar15,Unknown,uVar15,0,
                             (BinaryRegionComment *)((long)&enum_type.field_2 + 8));
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               *)local_428,&local_1730);
                  BinaryRegion::~BinaryRegion(&local_1730);
                  BinaryRegionComment::~BinaryRegionComment
                            ((BinaryRegionComment *)((long)&enum_type.field_2 + 8));
                  vtable_offset._4_4_ = 6;
                }
                goto LAB_0039e93f;
              default:
                break;
              case Vector64:
                std::__cxx11::string::operator=
                          ((string *)(offset_field_comment.name.field_2._M_local_buf + 8),
                           "(vector64)");
                uVar1 = uStack_da8;
                BVar2 = local_dac;
                sVar18 = offset_field_comment.index;
                BinaryRegionComment::BinaryRegionComment
                          (&local_1600,(BinaryRegionComment *)((long)&offset_prefix.field_2 + 8));
                anon_unknown_46::MakeBinaryRegion
                          (&local_1588,uVar15,uVar1,BVar2,0,sVar18,&local_1600);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           *)local_428,&local_1588);
                BinaryRegion::~BinaryRegion(&local_1588);
                BinaryRegionComment::~BinaryRegionComment(&local_1600);
                sVar18 = offset_field_comment.index;
                std::
                map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                ::map((map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                       *)&union_offset,&pVVar9->fields);
                BuildVector(this,sVar18,table,pFVar13,table_offset,
                            (map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                             *)&union_offset);
                std::
                map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                ::~map((map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                        *)&union_offset);
              }
              vtable_offset._4_4_ = 0;
LAB_0039e93f:
              std::__cxx11::string::~string((string *)local_e70);
              BinaryRegionComment::~BinaryRegionComment
                        ((BinaryRegionComment *)((long)&offset_prefix.field_2 + 8));
            }
LAB_0039e967:
          }
          pvVar22 = std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                          *)local_428);
          uVar15 = pvVar22->offset;
          pvVar22 = std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                          *)local_428);
          uVar15 = uVar15 + pvVar22->length;
          pEVar23 = (pointer)(uVar15 + 1);
          if (pEVar23 < fields.
                        super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            padding_comment.index =
                 (long)fields.
                       super__Vector_base<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + (1 - (long)pEVar23);
            BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_19a8);
            sVar18 = padding_comment.index;
            padding_comment.status_message.field_2._8_4_ = 4;
            BinaryRegionComment::BinaryRegionComment(&local_1ac0,(BinaryRegionComment *)local_19a8);
            anon_unknown_46::MakeBinaryRegion(&local_1a48,uVar15,sVar18,Uint8,sVar18,0,&local_1ac0);
            std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       *)local_428,&local_1a48);
            BinaryRegion::~BinaryRegion(&local_1a48);
            BinaryRegionComment::~BinaryRegionComment(&local_1ac0);
            BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_19a8);
          }
          pSVar7 = reflection::Object::name(table);
          String::str_abi_cxx11_(&local_1b20,pSVar7);
          std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
                    (&local_1b38,
                     (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      *)local_428);
          anon_unknown_46::MakeBinarySection(&local_1b00,&local_1b20,type,&local_1b38);
          AddSection(this,table_offset,&local_1b00);
          BinarySection::~BinarySection(&local_1b00);
          std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
          ~vector(&local_1b38);
          std::__cxx11::string::~string((string *)&local_1b20);
          std::
          vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
          ::~vector((vector<flatbuffers::BinaryAnnotator::VTable::Entry,_std::allocator<flatbuffers::BinaryAnnotator::VTable::Entry>_>
                     *)&__range1);
          vtable_offset._4_4_ = 0;
        }
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                   local_428);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
        anon_unknown_46::SetError
                  ((BinaryRegionComment *)&vtable_soffset,ERROR_OFFSET_OUT_OF_BINARY,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::allocator<char>::~allocator(&local_291);
        pSVar7 = reflection::Object::name(table);
        String::str_abi_cxx11_(&local_2f8,pSVar7);
        uVar15 = local_270;
        BinaryRegionComment::BinaryRegionComment
                  ((BinaryRegionComment *)
                   &regions.
                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (BinaryRegionComment *)&vtable_soffset);
        anon_unknown_46::MakeBinaryRegion
                  (&local_398,table_offset,4,SOffset,0,uVar15,
                   (BinaryRegionComment *)
                   &regions.
                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        anon_unknown_46::MakeSingleRegionBinarySection(&local_2d8,&local_2f8,type,&local_398);
        AddSection(this,table_offset,&local_2d8);
        BinarySection::~BinarySection(&local_2d8);
        BinaryRegion::~BinaryRegion(&local_398);
        BinaryRegionComment::~BinaryRegionComment
                  ((BinaryRegionComment *)
                   &regions.
                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&local_2f8);
        vtable_offset._4_4_ = 1;
      }
    }
    else {
      local_c0 = RemainingBytes(this,table_offset);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"4",&local_e1);
      anon_unknown_46::SetError
                ((BinaryRegionComment *)&vtable_soffset,ERROR_INCOMPLETE_BINARY,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
      pSVar7 = reflection::Object::name(table);
      String::str_abi_cxx11_(&local_148,pSVar7);
      uVar15 = local_c0;
      BinaryRegionComment::BinaryRegionComment(&local_260,(BinaryRegionComment *)&vtable_soffset);
      anon_unknown_46::MakeBinaryRegion(&local_1e8,table_offset,uVar15,Unknown,uVar15,0,&local_260);
      anon_unknown_46::MakeSingleRegionBinarySection(&local_128,&local_148,type,&local_1e8);
      AddSection(this,table_offset,&local_128);
      BinarySection::~BinarySection(&local_128);
      BinaryRegion::~BinaryRegion(&local_1e8);
      BinaryRegionComment::~BinaryRegionComment(&local_260);
      std::__cxx11::string::~string((string *)&local_148);
      vtable_offset._4_4_ = 1;
    }
    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&vtable_soffset);
  }
  return;
}

Assistant:

void BinaryAnnotator::BuildTable(const uint64_t table_offset,
                                 const BinarySectionType type,
                                 const reflection::Object *const table) {
  if (ContainsSection(table_offset)) { return; }

  BinaryRegionComment vtable_offset_comment;
  vtable_offset_comment.type = BinaryRegionCommentType::TableVTableOffset;

  const auto vtable_soffset = ReadScalar<int32_t>(table_offset);

  if (!vtable_soffset.has_value()) {
    const uint64_t remaining = RemainingBytes(table_offset);
    SetError(vtable_offset_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "4");

    AddSection(
        table_offset,
        MakeSingleRegionBinarySection(
            table->name()->str(), type,
            MakeBinaryRegion(table_offset, remaining, BinaryRegionType::Unknown,
                             remaining, 0, vtable_offset_comment)));

    // If there aren't enough bytes left to read the vtable offset, there is
    // nothing we can do.
    return;
  }

  // Tables start with the vtable
  const uint64_t vtable_offset = table_offset - vtable_soffset.value();

  if (!IsValidOffset(vtable_offset)) {
    SetError(vtable_offset_comment,
             BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);

    AddSection(table_offset,
               MakeSingleRegionBinarySection(
                   table->name()->str(), type,
                   MakeBinaryRegion(table_offset, sizeof(int32_t),
                                    BinaryRegionType::SOffset, 0, vtable_offset,
                                    vtable_offset_comment)));

    // There isn't much to do with an invalid vtable offset, as we won't be able
    // to intepret the rest of the table fields.
    return;
  }

  std::vector<BinaryRegion> regions;
  regions.push_back(MakeBinaryRegion(table_offset, sizeof(int32_t),
                                     BinaryRegionType::SOffset, 0,
                                     vtable_offset, vtable_offset_comment));

  // Parse the vtable first so we know what the rest of the fields in the table
  // are.
  const VTable *const vtable =
      GetOrBuildVTable(vtable_offset, table, table_offset);

  if (vtable == nullptr) {
    // There is no valid vtable for this table, so we cannot process the rest of
    // the table entries.
    return;
  }

  // This is the size and length of this table.
  const uint16_t table_size = vtable->table_size;
  uint64_t table_end_offset = table_offset + table_size;

  if (!IsValidOffset(table_end_offset - 1)) {
    // We already validated the table size in BuildVTable, but we have to make
    // sure we don't use a bad value here.
    table_end_offset = binary_length_;
  }

  // We need to iterate over the vtable fields by their offset in the binary,
  // not by their IDs. So copy them over to another vector that we can sort on
  // the offset_from_table property.
  std::vector<VTable::Entry> fields;
  for (const auto &vtable_field : vtable->fields) {
    fields.push_back(vtable_field.second);
  }

  std::stable_sort(fields.begin(), fields.end(),
                   [](const VTable::Entry &a, const VTable::Entry &b) {
                     return a.offset_from_table < b.offset_from_table;
                   });

  // Iterate over all the fields by order of their offset.
  for (size_t i = 0; i < fields.size(); ++i) {
    const reflection::Field *field = fields[i].field;
    const uint16_t offset_from_table = fields[i].offset_from_table;

    if (offset_from_table == 0) {
      // Skip non-present fields.
      continue;
    }

    // The field offsets are relative to the start of the table.
    const uint64_t field_offset = table_offset + offset_from_table;

    if (!IsValidOffset(field_offset)) {
      // The field offset is larger than the binary, nothing we can do.
      continue;
    }

    // We have a vtable entry for a non-existant field, that means its a binary
    // generated by a newer schema than we are currently processing.
    if (field == nullptr) {
      // Calculate the length of this unknown field.
      const uint64_t unknown_field_length =
          // Check if there is another unknown field after this one.
          ((i + 1 < fields.size())
               ? table_offset + fields[i + 1].offset_from_table
               // Otherwise use the known end of the table.
               : table_end_offset) -
          field_offset;

      if (unknown_field_length == 0) { continue; }

      std::string hint;

      if (unknown_field_length == 4) {
        const auto relative_offset = ReadScalar<uint32_t>(field_offset);
        if (relative_offset.has_value()) {
          // The field is 4 in length, so it could be an offset? Provide a hint.
          hint += "<possibly an offset? Check Loc: +0x";
          hint += ToHex(field_offset + relative_offset.value());
          hint += ">";
        }
      }

      BinaryRegionComment unknown_field_comment;
      unknown_field_comment.type = BinaryRegionCommentType::TableUnknownField;

      if (!IsValidRead(field_offset, unknown_field_length)) {
        const uint64_t remaining = RemainingBytes(field_offset);

        SetError(unknown_field_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
                 std::to_string(unknown_field_length));

        regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, unknown_field_comment));
        continue;
      }

      unknown_field_comment.default_value = hint;

      regions.push_back(MakeBinaryRegion(
          field_offset, unknown_field_length, BinaryRegionType::Unknown,
          unknown_field_length, 0, unknown_field_comment));
      continue;
    }

    if (IsScalar(field->type()->base_type())) {
      // These are the raw values store in the table.
      const uint64_t type_size = GetTypeSize(field->type()->base_type());
      const BinaryRegionType region_type =
          GetRegionType(field->type()->base_type());

      BinaryRegionComment scalar_field_comment;
      scalar_field_comment.type = BinaryRegionCommentType::TableField;
      scalar_field_comment.name =
          std::string(field->name()->c_str()) + "` (" +
          reflection::EnumNameBaseType(field->type()->base_type()) + ")";

      if (!IsValidRead(field_offset, type_size)) {
        const uint64_t remaining = RemainingBytes(field_offset);
        SetError(scalar_field_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
                 std::to_string(type_size));

        regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, scalar_field_comment));
        continue;
      }

      if (IsUnionType(field)) {
        // This is a type for a union. Validate the value
        const auto enum_value = ReadScalar<uint8_t>(field_offset);

        // This should always have a value, due to the IsValidRead check above.
        if (!IsValidUnionValue(field, enum_value.value())) {
          SetError(scalar_field_comment,
                   BinaryRegionStatus::ERROR_INVALID_UNION_TYPE);

          regions.push_back(MakeBinaryRegion(field_offset, type_size,
                                             region_type, 0, 0,
                                             scalar_field_comment));
          continue;
        }
      }

      regions.push_back(MakeBinaryRegion(field_offset, type_size, region_type,
                                         0, 0, scalar_field_comment));
      continue;
    }

    // Read the offset
    uint64_t offset = 0;
    uint64_t length = sizeof(uint32_t);
    BinaryRegionType region_type = BinaryRegionType::UOffset;

    if (field->offset64()) {
      length = sizeof(uint64_t);
      region_type = BinaryRegionType::UOffset64;
      offset = ReadScalar<uint64_t>(field_offset).value_or(0);
    } else {
      offset = ReadScalar<uint32_t>(field_offset).value_or(0);
    }
    // const auto offset_from_field = ReadScalar<uint32_t>(field_offset);
    uint64_t offset_of_next_item = 0;
    BinaryRegionComment offset_field_comment;
    offset_field_comment.type = BinaryRegionCommentType::TableOffsetField;
    offset_field_comment.name = field->name()->c_str();
    const std::string offset_prefix =
        "offset to field `" + std::string(field->name()->c_str()) + "`";

    // Validate any field that isn't inline (i.e., non-structs).
    if (!IsInlineField(field)) {
      if (offset == 0) {
        const uint64_t remaining = RemainingBytes(field_offset);

        SetError(offset_field_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

        regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, offset_field_comment));
        continue;
      }

      offset_of_next_item = field_offset + offset;

      if (!IsValidOffset(offset_of_next_item)) {
        SetError(offset_field_comment,
                 BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        continue;
      }
    }

    switch (field->type()->base_type()) {
      case reflection::BaseType::Obj: {
        const reflection::Object *next_object =
            schema_->objects()->Get(field->type()->index());

        if (next_object->is_struct()) {
          // Structs are stored inline.
          BuildStruct(field_offset, regions, field->name()->c_str(),
                      next_object);
        } else {
          offset_field_comment.default_value = "(table)";

          regions.push_back(MakeBinaryRegion(field_offset, length, region_type,
                                             0, offset_of_next_item,
                                             offset_field_comment));

          BuildTable(offset_of_next_item, BinarySectionType::Table,
                     next_object);
        }
      } break;

      case reflection::BaseType::String: {
        offset_field_comment.default_value = "(string)";
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        BuildString(offset_of_next_item, table, field);
      } break;

      case reflection::BaseType::Vector: {
        offset_field_comment.default_value = "(vector)";
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        BuildVector(offset_of_next_item, table, field, table_offset,
                    vtable->fields);
      } break;
      case reflection::BaseType::Vector64: {
        offset_field_comment.default_value = "(vector64)";
        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           offset_of_next_item,
                                           offset_field_comment));
        BuildVector(offset_of_next_item, table, field, table_offset,
                    vtable->fields);
      } break;

      case reflection::BaseType::Union: {
        const uint64_t union_offset = offset_of_next_item;

        // The union type field is always one less than the union itself.
        const uint16_t union_type_id = field->id() - 1;

        auto vtable_field = vtable->fields.find(union_type_id);
        if (vtable_field == vtable->fields.end()) {
          // TODO(dbaileychess): need to capture this error condition.
          break;
        }
        offset_field_comment.default_value = "(union)";

        const uint64_t type_offset =
            table_offset + vtable_field->second.offset_from_table;

        const auto realized_type = ReadScalar<uint8_t>(type_offset);
        if (!realized_type.has_value()) {
          const uint64_t remaining = RemainingBytes(type_offset);
          SetError(offset_field_comment,
                   BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "1");
          regions.push_back(MakeBinaryRegion(
              type_offset, remaining, BinaryRegionType::Unknown, remaining, 0,
              offset_field_comment));
          continue;
        }

        if (!IsValidUnionValue(field, realized_type.value())) {
          // We already export an error in the union type field, so just skip
          // building the union itself and it will default to an unreference
          // Binary section.
          continue;
        }

        const std::string enum_type =
            BuildUnion(union_offset, realized_type.value(), field);

        offset_field_comment.default_value =
            "(union of type `" + enum_type + "`)";

        regions.push_back(MakeBinaryRegion(field_offset, length, region_type, 0,
                                           union_offset, offset_field_comment));

      } break;

      default: break;
    }
  }

  // Handle the case where there is padding after the last known binary
  // region. Calculate where we left off towards the expected end of the
  // table.
  const uint64_t i = regions.back().offset + regions.back().length + 1;

  if (i < table_end_offset) {
    const uint64_t pad_bytes = table_end_offset - i + 1;

    BinaryRegionComment padding_comment;
    padding_comment.type = BinaryRegionCommentType::Padding;

    regions.push_back(MakeBinaryRegion(i - 1, pad_bytes * sizeof(uint8_t),
                                       BinaryRegionType::Uint8, pad_bytes, 0,
                                       padding_comment));
  }

  AddSection(table_offset,
             MakeBinarySection(table->name()->str(), type, std::move(regions)));
}